

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O2

void dfct(int n,double *a,double *t,int *ip,double *w)

{
  double *c;
  uint nc;
  uint uVar1;
  int iVar2;
  long lVar3;
  double *pdVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  double *pdVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  bool bVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  iVar13 = *ip;
  if (iVar13 * 8 < n) {
    iVar13 = n >> 3;
    makewt(iVar13,ip,w);
  }
  uVar12 = n >> 1;
  nc = ip[1];
  if (ip[1] * 2 < n) {
    makect(uVar12,ip,w + iVar13);
    nc = uVar12;
  }
  lVar3 = (long)(int)uVar12;
  dVar16 = a[lVar3];
  lVar10 = (long)n;
  dVar18 = *a + a[lVar10];
  *a = *a - a[lVar10];
  *t = dVar18 - dVar16;
  t[lVar3] = dVar18 + dVar16;
  if (n < 3) {
    a[1] = *a;
    a[2] = *t;
    dVar16 = t[1];
  }
  else {
    uVar11 = (ulong)(uVar12 >> 1);
    lVar5 = lVar10 - lVar3;
    uVar6 = 1;
    lVar8 = lVar10;
    while( true ) {
      lVar8 = lVar8 + -1;
      lVar3 = lVar3 + -1;
      lVar5 = lVar5 + 1;
      if (uVar11 <= uVar6) break;
      dVar15 = a[uVar6] + a[lVar8];
      dVar16 = a[lVar3];
      dVar18 = a[lVar5];
      dVar17 = dVar16 + dVar18;
      a[uVar6] = a[uVar6] - a[lVar8];
      a[lVar3] = dVar16 - dVar18;
      t[uVar6] = dVar15 - dVar17;
      t[lVar3] = dVar17 + dVar15;
      uVar6 = uVar6 + 1;
    }
    iVar2 = n - (uVar12 >> 1);
    t[uVar11] = a[uVar11] + a[iVar2];
    a[uVar11] = a[uVar11] - a[iVar2];
    c = w + iVar13;
    dctsub(uVar12,a,nc,c);
    if ((int)uVar12 < 5) {
      if (uVar12 == 4) {
        cftfsub(4,a,w);
      }
    }
    else {
      bitrv2(uVar12,ip + 2,a);
      cftfsub(uVar12,a,w);
      rftfsub(uVar12,a,nc,c);
    }
    a[(ulong)(uint)n - 1] = *a - a[1];
    a[1] = *a + a[1];
    pdVar4 = a + (ulong)(uVar12 - 2) + 1;
    uVar1 = uVar12 * 2;
    while( true ) {
      if ((int)uVar12 < 4) break;
      dVar16 = pdVar4[-1];
      a[uVar1 - 3] = *pdVar4 + dVar16;
      a[(ulong)(uVar1 - 4) - 1] = dVar16 - *pdVar4;
      uVar12 = uVar12 - 2;
      pdVar4 = pdVar4 + -2;
      uVar1 = uVar1 - 4;
    }
    iVar13 = 2;
    while( true ) {
      lVar3 = (long)iVar13;
      uVar12 = (uint)uVar11;
      if (uVar12 < 2) break;
      dctsub(uVar12,t,nc,c);
      if (uVar12 < 5) {
        if (uVar12 == 4) {
          cftfsub(4,t,w);
        }
      }
      else {
        bitrv2(uVar12,ip + 2,t);
        cftfsub(uVar12,t,w);
        rftfsub(uVar12,t,nc,c);
      }
      a[n - iVar13] = *t - t[1];
      a[lVar3] = *t + t[1];
      lVar8 = (long)(iVar13 * 4);
      for (uVar6 = 2; uVar6 < uVar11; uVar6 = uVar6 + 2) {
        a[lVar8 - lVar3] = t[uVar6] - t[uVar6 + 1];
        (a + lVar3)[lVar8] = t[uVar6] + t[uVar6 + 1];
        lVar8 = lVar8 + iVar13 * 4;
      }
      uVar6 = uVar11 >> 1;
      pdVar4 = t;
      uVar7 = uVar6;
      pdVar9 = t;
      while (bVar14 = uVar7 != 0, uVar7 = uVar7 - 1, bVar14) {
        dVar16 = pdVar9[uVar11];
        *pdVar9 = pdVar4[uVar11 * 2] - dVar16;
        pdVar4[uVar11] = dVar16 + pdVar4[uVar11 * 2];
        pdVar9 = pdVar9 + 1;
        pdVar4 = pdVar4 + -1;
      }
      iVar13 = iVar13 * 2;
      t[uVar6] = t[uVar12 + (int)uVar6];
      uVar11 = uVar6;
    }
    a[lVar3] = *t;
    a[lVar10] = t[2] - t[1];
    dVar16 = t[2] + t[1];
  }
  *a = dVar16;
  return;
}

Assistant:

void dfct(int n, double *a, double *t, int *ip, double *w)
{
    void makewt(int nw, int *ip, double *w);
    void makect(int nc, int *ip, double *c);
    void bitrv2(int n, int *ip, double *a);
    void cftfsub(int n, double *a, double *w);
    void rftfsub(int n, double *a, int nc, double *c);
    void dctsub(int n, double *a, int nc, double *c);
    int j, k, l, m, mh, nw, nc;
    double xr, xi, yr, yi;
    
    nw = ip[0];
    if (n > (nw << 3)) {
        nw = n >> 3;
        makewt(nw, ip, w);
    }
    nc = ip[1];
    if (n > (nc << 1)) {
        nc = n >> 1;
        makect(nc, ip, w + nw);
    }
    m = n >> 1;
    yi = a[m];
    xi = a[0] + a[n];
    a[0] -= a[n];
    t[0] = xi - yi;
    t[m] = xi + yi;
    if (n > 2) {
        mh = m >> 1;
        for (j = 1; j < mh; j++) {
            k = m - j;
            xr = a[j] - a[n - j];
            xi = a[j] + a[n - j];
            yr = a[k] - a[n - k];
            yi = a[k] + a[n - k];
            a[j] = xr;
            a[k] = yr;
            t[j] = xi - yi;
            t[k] = xi + yi;
        }
        t[mh] = a[mh] + a[n - mh];
        a[mh] -= a[n - mh];
        dctsub(m, a, nc, w + nw);
        if (m > 4) {
            bitrv2(m, ip + 2, a);
            cftfsub(m, a, w);
            rftfsub(m, a, nc, w + nw);
        } else if (m == 4) {
            cftfsub(m, a, w);
        }
        a[n - 1] = a[0] - a[1];
        a[1] = a[0] + a[1];
        for (j = m - 2; j >= 2; j -= 2) {
            a[2 * j + 1] = a[j] + a[j + 1];
            a[2 * j - 1] = a[j] - a[j + 1];
        }
        l = 2;
        m = mh;
        while (m >= 2) {
            dctsub(m, t, nc, w + nw);
            if (m > 4) {
                bitrv2(m, ip + 2, t);
                cftfsub(m, t, w);
                rftfsub(m, t, nc, w + nw);
            } else if (m == 4) {
                cftfsub(m, t, w);
            }
            a[n - l] = t[0] - t[1];
            a[l] = t[0] + t[1];
            k = 0;
            for (j = 2; j < m; j += 2) {
                k += l << 2;
                a[k - l] = t[j] - t[j + 1];
                a[k + l] = t[j] + t[j + 1];
            }
            l <<= 1;
            mh = m >> 1;
            for (j = 0; j < mh; j++) {
                k = m - j;
                t[j] = t[m + k] - t[m + j];
                t[k] = t[m + k] + t[m + j];
            }
            t[mh] = t[m + mh];
            m = mh;
        }
        a[l] = t[0];
        a[n] = t[2] - t[1];
        a[0] = t[2] + t[1];
    } else {
        a[1] = a[0];
        a[2] = t[0];
        a[0] = t[1];
    }
}